

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::
iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>
::SearchFrom(iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::KeyValuePair>
             *this,size_type start_bucket)

{
  Node *pNVar1;
  Node *pNVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  InnerMap *pIVar5;
  size_type sVar6;
  Tree *tree;
  LogFinisher local_51;
  LogMessage local_50;
  
  pIVar5 = this->m_;
  uVar4 = pIVar5->num_buckets_;
  if ((pIVar5->index_of_first_non_null_ != uVar4) &&
     (pIVar5->table_[pIVar5->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x191);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: m_->index_of_first_non_null_ == m_->num_buckets_ || m_->table_[m_->index_of_first_non_null_] != NULL: "
                       );
    internal::LogFinisher::operator=(&local_51,pLVar3);
    internal::LogMessage::~LogMessage(&local_50);
    pIVar5 = this->m_;
    uVar4 = pIVar5->num_buckets_;
  }
  this->node_ = (Node *)0x0;
  sVar6 = start_bucket;
  if (start_bucket < uVar4) {
    do {
      pNVar1 = (Node *)pIVar5->table_[start_bucket];
      if (pNVar1 != (Node *)0x0) {
        pNVar2 = (Node *)pIVar5->table_[start_bucket ^ 1];
        this->bucket_index_ = start_bucket;
        if (pNVar1 != pNVar2) {
          this->node_ = pNVar1;
          return;
        }
        if (pNVar1[1].kv.k_._M_dataplus._M_p == (pointer)0x0) {
          internal::LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x19a);
          pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: !tree->empty(): ");
          internal::LogFinisher::operator=(&local_51,pLVar3);
          internal::LogMessage::~LogMessage(&local_50);
        }
        this->node_ = (Node *)(((pNVar1->kv).v_)->second).super_MessageLite._vptr_MessageLite;
        return;
      }
      start_bucket = start_bucket + 1;
      sVar6 = uVar4;
    } while (uVar4 != start_bucket);
  }
  this->bucket_index_ = sVar6;
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != NULL);
        node_ = NULL;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodePtrFromKeyPtr(*tree->begin());
            break;
          }
        }
      }